

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O3

int __thiscall HevcVpsUnit::deserialize(HevcVpsUnit *this)

{
  BitStreamReader *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  
  iVar2 = HevcUnit::deserialize((HevcUnit *)this);
  if (iVar2 == 0) {
    this_00 = &(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader;
    BitStreamReader::skipBits(this_00,0xc);
    uVar3 = BitStreamReader::getBits(this_00,3);
    bVar6 = (char)uVar3 + 1;
    iVar2 = 1;
    if (bVar6 < 8) {
      BitStreamReader::skipBits(this_00,0x11);
      uVar3 = (uint)bVar6;
      iVar4 = HevcUnitWithProfile::profile_tier_level(&this->super_HevcUnitWithProfile,uVar3);
      if (iVar4 == 0) {
        bVar1 = BitStreamReader::getBit(this_00);
        iVar4 = 0;
        if (!bVar1) {
          iVar4 = uVar3 - 1;
        }
        iVar7 = uVar3 - iVar4;
        if (iVar7 != 0 && iVar4 <= (int)(uint)bVar6) {
          do {
            uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
            uVar5 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
            if (uVar3 < uVar5) {
              return 1;
            }
            uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
            if (uVar3 == 0xffffffff) {
              return 1;
            }
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        uVar3 = BitStreamReader::getBits(this_00,6);
        uVar5 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
        if (uVar5 < 0x400) {
          if (uVar5 != 0) {
            iVar4 = (uVar3 & 0xff) + 1;
            iVar2 = iVar4;
            uVar3 = 1;
            do {
              do {
                BitStreamReader::skipBit(this_00);
                iVar2 = iVar2 + -1;
              } while (iVar2 != 0);
              bVar1 = uVar3 != uVar5;
              iVar2 = iVar4;
              uVar3 = uVar3 + 1;
            } while (bVar1);
          }
          bVar1 = BitStreamReader::getBit(this_00);
          iVar2 = 0;
          if (bVar1) {
            this->num_units_in_tick_bit_pos =
                 ((*(int *)&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader.
                            super_BitStream.m_buffer -
                  *(int *)&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader.super_BitStream
                           .m_initBuffer) * 8 -
                 (this->super_HevcUnitWithProfile).super_HevcUnit.m_reader.m_bitLeft) + 0x20;
            uVar3 = BitStreamReader::getBits(this_00,0x20);
            this->num_units_in_tick = uVar3;
            uVar3 = BitStreamReader::getBits(this_00,0x20);
            this->time_scale = uVar3;
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int HevcVpsUnit::deserialize()
{
    const int rez = HevcUnit::deserialize();
    if (rez)
        return rez;

    try
    {
        m_reader.skipBits(12);  // vps_id, reserved, vps_max_layers
        const uint8_t vps_max_sub_layers = m_reader.getBits<uint8_t>(3) + 1;
        if (vps_max_sub_layers > 7)
            return 1;
        m_reader.skipBits(17);  // vps_temporal_id_nesting_flag, vps_reserved_0xffff_16bits
        if (profile_tier_level(vps_max_sub_layers) != 0)
            return 1;

        const bool vps_sub_layer_ordering_info_present_flag = m_reader.getBit();
        for (int i = (vps_sub_layer_ordering_info_present_flag ? 0 : vps_max_sub_layers - 1);
             i <= vps_max_sub_layers - 1; i++)
        {
            const unsigned vps_max_dec_pic_buffering_minus1 = extractUEGolombCode();
            if (extractUEGolombCode() > vps_max_dec_pic_buffering_minus1)  // vps_max_num_reorder_pics
                return 1;
            if (extractUEGolombCode() == UINT_MAX)  // vps_max_latency_increase_plus1
                return 1;
        }
        const auto vps_max_layer_id = m_reader.getBits<uint8_t>(6);
        const unsigned vps_num_layer_sets_minus1 = extractUEGolombCode();
        if (vps_num_layer_sets_minus1 > 1023)
            return 1;
        for (unsigned i = 1; i <= vps_num_layer_sets_minus1; i++)
        {
            for (int j = 0; j <= vps_max_layer_id; j++) m_reader.skipBit();  // layer_id_included_flag[ i ][ j ] u(1)
        }
        if (m_reader.getBit())  // vps_timing_info_present_flag
        {
            num_units_in_tick_bit_pos = m_reader.getBitsCount();
            num_units_in_tick = m_reader.getBits(32);
            time_scale = m_reader.getBits(32);
        }

        return rez;
    }
    catch (VodCoreException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}